

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

bool __thiscall
flatbuffers::SymbolTable<flatbuffers::Value>::Add
          (SymbolTable<flatbuffers::Value> *this,string *name,Value *e)

{
  pointer *pppVVar1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  mapped_type pVVar3;
  iterator iVar4;
  mapped_type *ppVVar5;
  mapped_type local_30;
  
  __position._M_current =
       (this->vec).super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_30 = e;
  if (__position._M_current ==
      (this->vec).super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flatbuffers::Value*,std::allocator<flatbuffers::Value*>>::
    _M_realloc_insert<flatbuffers::Value*&>
              ((vector<flatbuffers::Value*,std::allocator<flatbuffers::Value*>> *)&this->vec,
               __position,&local_30);
  }
  else {
    *__position._M_current = e;
    pppVVar1 = &(this->vec).
                super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)this,name);
  pVVar3 = local_30;
  p_Var2 = &(this->dict)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var2) {
    ppVVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::operator[](&this->dict,name);
    *ppVVar5 = pVVar3;
  }
  return (_Rb_tree_header *)iVar4._M_node != p_Var2;
}

Assistant:

bool Add(const std::string &name, T *e) {
    vec.emplace_back(e);
    auto it = dict.find(name);
    if (it != dict.end()) return true;
    dict[name] = e;
    return false;
  }